

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_clnt.c
# Opt level: O0

CLIENT * local_rpcb(char *tag)

{
  mem_format_t p_Var1;
  int iVar2;
  u_int sendsz;
  size_t sVar3;
  void *handlep;
  char *pcVar4;
  netconfig *nconf_00;
  CLIENT *pCVar5;
  int fd;
  void *nc_handle;
  netconfig *tmpnconf;
  netconfig *nconf;
  int sock;
  size_t tsize;
  sockaddr_un sun;
  netbuf nbuf;
  char *t;
  CLIENT *client;
  char *tag_local;
  
  memset((void *)((long)&tsize + 2),0,0x6e);
  iVar2 = socket(1,1,0);
  if (iVar2 < 0) {
    t = (char *)clnt_raw_ncreate(100000,3);
  }
  else {
    tsize._2_2_ = 1;
    strcpy((char *)((long)&tsize + 4),"/var/run/rpcbind.sock");
    sVar3 = strlen((char *)((long)&tsize + 4));
    sun.sun_path._104_4_ = (int)sVar3 + 2;
    sun.sun_path[100] = 'n';
    sun.sun_path[0x65] = '\0';
    sun.sun_path[0x66] = '\0';
    sun.sun_path[0x67] = '\0';
    sendsz = __rpc_get_t_size(1,0,0);
    t = (char *)clnt_vc_ncreatef(iVar2,(netbuf *)(sun.sun_path + 100),100000,3,sendsz,sendsz,
                                 0x10000010);
    if ((((CLIENT *)t)->cl_error).re_status == RPC_SUCCESS) {
      return (CLIENT *)t;
    }
    pcVar4 = rpc_sperror(&((CLIENT *)t)->cl_error,tag);
    if ((__ntirpc_pkg_params.debug_flags & 0x8000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s",pcVar4);
    }
    mem_free(pcVar4,0x100);
    close(iVar2);
  }
  pthread_mutex_lock((pthread_mutex_t *)&loopnconf_lock);
  if (local_rpcb::loopnconf == (netconfig *)0x0) {
    nc_handle = (void *)0x0;
    handlep = setnetconfig();
    if (handlep == (void *)0x0) {
      syslog(3,"rpc: failed to open /etc/netconfig");
      pthread_mutex_unlock((pthread_mutex_t *)&loopnconf_lock);
      p_Var1 = __ntirpc_pkg_params.warnx_;
      if ((__ntirpc_pkg_params.debug_flags & 4) != 0) {
        pcVar4 = clnt_sperrno(RPC_UNKNOWNPROTO);
        (*p_Var1)("%s(%s): failed to open /etc/netconfig %s","local_rpcb",tag,pcVar4);
      }
      t[0x58] = '\x11';
      t[0x59] = '\0';
      t[0x5a] = '\0';
      t[0x5b] = '\0';
      return (CLIENT *)t;
    }
    while (nconf_00 = getnetconfig(handlep), nconf_00 != (netconfig *)0x0) {
      iVar2 = strcmp(nconf_00->nc_protofmly,"inet6");
      if ((((iVar2 == 0) || (iVar2 = strcmp(nconf_00->nc_protofmly,"inet"), iVar2 == 0)) &&
          ((nconf_00->nc_semantics == 2 || (nconf_00->nc_semantics == 3)))) &&
         (iVar2 = __rpc_nconf2fd(nconf_00), -1 < iVar2)) {
        close(iVar2);
        iVar2 = strcmp(nconf_00->nc_protofmly,"inet");
        nc_handle = nconf_00;
        if (iVar2 == 0) {
          local_rpcb::hostname = "127.0.0.1";
        }
        else {
          local_rpcb::hostname = "::1";
        }
      }
    }
    if (nc_handle == (void *)0x0) {
      endnetconfig(handlep);
      pthread_mutex_unlock((pthread_mutex_t *)&loopnconf_lock);
      p_Var1 = __ntirpc_pkg_params.warnx_;
      if ((__ntirpc_pkg_params.debug_flags & 4) != 0) {
        pcVar4 = clnt_sperrno(RPC_UNKNOWNPROTO);
        (*p_Var1)("%s(%s): failed to find /etc/netconfig %s","local_rpcb",tag,pcVar4);
      }
      t[0x58] = '\x11';
      t[0x59] = '\0';
      t[0x5a] = '\0';
      t[0x5b] = '\0';
      return (CLIENT *)t;
    }
    local_rpcb::loopnconf = getnetconfigent(*nc_handle);
    endnetconfig(handlep);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&loopnconf_lock);
  clnt_destroy_it((CLIENT *)t,"local_rpcb",0x568);
  pCVar5 = getclnthandle(local_rpcb::hostname,local_rpcb::loopnconf,(char **)0x0);
  return pCVar5;
}

Assistant:

static CLIENT *local_rpcb(const char *tag)
{
	CLIENT *client = NULL;
	char *t;
	static struct netconfig *loopnconf = NULL;
	static char *hostname;
	extern mutex_t loopnconf_lock;
	struct netbuf nbuf;
	struct sockaddr_un sun;
	size_t tsize;
	int sock;

	/*
	 * Try connecting to the local rpcbind through a local socket
	 * first. If this doesn't work, try all transports defined in
	 * the netconfig file.
	 */
	memset(&sun, 0, sizeof(sun));
	sock = socket(AF_LOCAL, SOCK_STREAM, 0);
	if (sock < 0) {
		/* For error codes */
		client = clnt_raw_ncreate(RPCBPROG, RPCBVERS);
		goto try_nconf;
	}
	sun.sun_family = AF_LOCAL;
	strcpy(sun.sun_path, _PATH_RPCBINDSOCK);
	nbuf.len = SUN_LEN(&sun);
	nbuf.maxlen = sizeof(struct sockaddr_un);
	nbuf.buf = &sun;

	tsize = __rpc_get_t_size(AF_LOCAL, 0, 0);
	client = clnt_vc_ncreatef(sock, &nbuf, (rpcprog_t) RPCBPROG,
				  (rpcvers_t) RPCBVERS, tsize, tsize,
				  CLNT_CREATE_FLAG_CLOSE |
				  CLNT_CREATE_FLAG_CONNECT);

	if (CLNT_SUCCESS(client)) {
		return client;
	}
	t = rpc_sperror(&client->cl_error, tag);

	__warnx(TIRPC_DEBUG_FLAG_CLNT_RPCB, "%s", t);
	mem_free(t, RPC_SPERROR_BUFLEN);

	/* Save client for error return */

	/* Nobody needs this socket anymore; free the descriptor. */
	close(sock);

 try_nconf:
	/* VARIABLES PROTECTED BY loopnconf_lock: loopnconf */
	mutex_lock(&loopnconf_lock);
	if (loopnconf == NULL) {
		struct netconfig *nconf, *tmpnconf = NULL;
		void *nc_handle;
		int fd;

		nc_handle = setnetconfig();
		if (nc_handle == NULL) {
			/* fails to open netconfig file */
			syslog(LOG_ERR, "rpc: failed to open " NETCONFIG);
			mutex_unlock(&loopnconf_lock);
			__warnx(TIRPC_DEBUG_FLAG_WARN,
				"%s(%s): failed to open " NETCONFIG " %s",
				__func__, tag, clnt_sperrno(RPC_UNKNOWNPROTO));
			client->cl_error.re_status = RPC_UNKNOWNPROTO;
			return (client);
		}
		while ((nconf = getnetconfig(nc_handle)) != NULL) {
#ifdef INET6
			if ((strcmp(nconf->nc_protofmly, NC_INET6) == 0 ||
#else
			if ((
#endif
				    strcmp(nconf->nc_protofmly, NC_INET) == 0)
			    && (nconf->nc_semantics == NC_TPI_COTS
				|| nconf->nc_semantics == NC_TPI_COTS_ORD)) {
				fd = __rpc_nconf2fd(nconf);
				/*
				 * Can't create a socket, assume that
				 * this family isn't configured in the kernel.
				 */
				if (fd < 0)
					continue;
				close(fd);
				tmpnconf = nconf;
				if (!strcmp(nconf->nc_protofmly, NC_INET))
					hostname = IN4_LOCALHOST_STRING;
				else
					hostname = IN6_LOCALHOST_STRING;
			}
		}
		if (tmpnconf == NULL) {
			endnetconfig(nc_handle);
			mutex_unlock(&loopnconf_lock);
			__warnx(TIRPC_DEBUG_FLAG_WARN,
				"%s(%s): failed to find " NETCONFIG " %s",
				__func__, tag, clnt_sperrno(RPC_UNKNOWNPROTO));
			client->cl_error.re_status = RPC_UNKNOWNPROTO;
			return (client);
		}
		loopnconf = getnetconfigent(tmpnconf->nc_netid);
		/* loopnconf is never freed */
		endnetconfig(nc_handle);
	}